

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int **pp_Var1;
  SourceLocation location;
  DatagramPort DVar2;
  int osErrorNumber;
  SocketAddress *pSVar3;
  iovec *piVar4;
  long lVar5;
  FixVoid<unsigned_long> value;
  void *pvVar6;
  size_t sVar7;
  long *plVar8;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1828:48)>
  *location_00;
  long lVar9;
  undefined4 in_register_00000034;
  Exception *pEVar10;
  PromiseFulfiller<void> *count;
  undefined4 in_register_00000084;
  NetworkAddressImpl *this_00;
  Iterator __end2;
  size_t count_00;
  size_t *psVar11;
  bool bVar12;
  undefined1 local_228 [32];
  Fault f;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Array<unsigned_char> extra;
  Array<iovec> iov_heap;
  DatagramPort local_198;
  undefined *local_190;
  undefined *puStack_188;
  undefined8 local_180;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_178;
  msghdr local_170;
  iovec iov_stack [16];
  
  this_00 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  pEVar10 = (Exception *)CONCAT44(in_register_00000034,__fd);
  local_170.msg_controllen = 0;
  local_170.msg_flags = 0;
  local_170._52_4_ = 0;
  local_170.msg_iovlen = 0;
  local_170.msg_control = (void *)0x0;
  local_170.msg_namelen = 0;
  local_170._12_4_ = 0;
  local_170.msg_iov = (iovec *)0x0;
  pSVar3 = NetworkAddressImpl::chooseOneAddress(this_00);
  local_170.msg_name = &pSVar3->addr;
  local_170.msg_namelen = pSVar3->addrlen;
  count = (PromiseFulfiller<void> *)0x400;
  if (__n < 0x400) {
    count = (PromiseFulfiller<void> *)__n;
  }
  local_228._16_8_ = this_00;
  local_228._24_8_ = count;
  if (__n < 0x11) {
    iov_heap.ptr = (iovec *)0x0;
    iov_heap.size_ = 0;
    iov_heap.disposer = (ArrayDisposer *)0x0;
    piVar4 = iov_stack;
  }
  else {
    piVar4 = kj::_::HeapArrayDisposer::allocate<iovec>((size_t)count);
    iov_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    iov_heap.ptr = piVar4;
    iov_heap.size_ = (size_t)count;
  }
  lVar5 = 8;
  sVar7 = __n;
  while (bVar12 = sVar7 != 0, sVar7 = sVar7 - 1, bVar12) {
    *(undefined8 *)((long)piVar4 + lVar5 + -8) = *(undefined8 *)((long)__buf + lVar5 + -8);
    *(undefined8 *)((long)&piVar4->iov_base + lVar5) = *(undefined8 *)((long)__buf + lVar5);
    lVar5 = lVar5 + 0x10;
  }
  extra.ptr = (uchar *)0x0;
  extra.size_ = 0;
  extra.disposer = (ArrayDisposer *)0x0;
  local_228._8_8_ = __n;
  if (0x400 < __n) {
    lVar5 = __n - 0x3ff;
    plVar8 = (long *)((long)__buf + 0x3ff8);
    count_00 = 0;
    while (bVar12 = lVar5 != 0, lVar5 = lVar5 + -1, bVar12) {
      count_00 = count_00 + *plVar8;
      plVar8 = plVar8 + 2;
    }
    f.exception = (Exception *)kj::_::HeapArrayDisposer::allocate<unsigned_char>(count_00);
    Array<unsigned_char>::operator=(&extra,(Array<unsigned_char> *)&f);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&f);
    lVar5 = local_228._8_8_ - 0x3ff;
    psVar11 = (size_t *)((long)__buf + 0x3ff8);
    lVar9 = 0;
    while( true ) {
      bVar12 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar12) break;
      memcpy(extra.ptr + lVar9,(void *)psVar11[-1],*psVar11);
      lVar9 = lVar9 + *psVar11;
      psVar11 = psVar11 + 2;
    }
    piVar4[(long)((long)&(((PromiseFulfiller<void> *)(local_228._24_8_ + -8))->super_PromiseRejector
                         )._vptr_PromiseRejector + 7)].iov_base = extra.ptr;
    piVar4[(long)((long)&(((PromiseFulfiller<void> *)(local_228._24_8_ + -8))->super_PromiseRejector
                         )._vptr_PromiseRejector + 7)].iov_len = extra.size_;
  }
  local_170.msg_iovlen = local_228._24_8_;
  local_170.msg_iov = (iovec *)piVar4;
  do {
    value = sendmsg((int)(pEVar10->ownFile).content.size_,&local_170,0);
    if (-1 < (long)value) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,value);
      goto LAB_003ea8a3;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x721,osErrorNumber,"n = sendmsg(fd, &msg, 0)","");
    kj::_::Debug::Fault::fatal(&f);
  }
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_228);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1828:48)>
       ::anon_class_32_3_8270f0b6_for_func::operator();
  pp_Var1 = ((SleepHooks *)&((PromiseArenaMember *)local_228._0_8_)->arena)->_vptr_SleepHooks;
  f.exception = pEVar10;
  if (pp_Var1 == (_func_int **)0x0 || (ulong)(local_228._0_8_ - (long)pp_Var1) < 0x40) {
    pvVar6 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1828:48)>
                   *)((long)pvVar6 + 0x3c0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__1,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_228,
               (anon_class_32_3_8270f0b6_for_func *)&f,&continuationTracePtr);
    *(void **)((long)pvVar6 + 0x3c8) = pvVar6;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_228._0_8_)->arena)->_vptr_SleepHooks =
         (_func_int **)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1828:48)>
                   *)(local_228._0_8_ + -0x40);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::NetworkAddress&)::__1,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_228,
               (anon_class_32_3_8270f0b6_for_func *)&f,&continuationTracePtr);
    ((unsigned_long *)(local_228._0_8_ + -0x40))[1] = (unsigned_long)pp_Var1;
  }
  local_190 = &DAT_0042a172;
  puStack_188 = &DAT_0042a1d1;
  local_180 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<unsigned_long>
            ((OwnPromiseNode *)&local_198,(Promise<unsigned_long> *)&intermediate,location);
  DVar2._vptr_DatagramPort = local_198._vptr_DatagramPort;
  local_198._vptr_DatagramPort = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_198);
  (this->super_DatagramPort)._vptr_DatagramPort = DVar2._vptr_DatagramPort;
  local_178.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_228);
LAB_003ea8a3:
  Array<unsigned_char>::~Array(&extra);
  Array<iovec>::~Array(&iov_heap);
  return (ssize_t)this;
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const ArrayPtr<const byte>> pieces, NetworkAddress& destination) {
  struct msghdr msg;
  memset(&msg, 0, sizeof(msg));

  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();
  msg.msg_name = const_cast<void*>(implicitCast<const void*>(addr.getRaw()));
  msg.msg_namelen = addr.getRawSize();

  const size_t iovmax = kj::miniposix::iovMax();
  KJ_STACK_ARRAY(struct iovec, iov, kj::min(pieces.size(), iovmax), 16, 64);

  for (size_t i: kj::indices(pieces)) {
    iov[i].iov_base = const_cast<void*>(implicitCast<const void*>(pieces[i].begin()));
    iov[i].iov_len = pieces[i].size();
  }

  Array<byte> extra;
  if (pieces.size() > iovmax) {
    // Too many pieces, but we can't use multiple syscalls because they'd send separate
    // datagrams. We'll have to copy the trailing pieces into a temporary array.
    //
    // TODO(perf): On Linux we could use multiple syscalls via MSG_MORE or sendmsg/sendmmsg.
    size_t extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      extraSize += pieces[i].size();
    }
    extra = kj::heapArray<byte>(extraSize);
    extraSize = 0;
    for (size_t i = iovmax - 1; i < pieces.size(); i++) {
      memcpy(extra.begin() + extraSize, pieces[i].begin(), pieces[i].size());
      extraSize += pieces[i].size();
    }
    iov.back().iov_base = extra.begin();
    iov.back().iov_len = extra.size();
  }

  msg.msg_iov = iov.begin();
  msg.msg_iovlen = iov.size();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendmsg(fd, &msg, 0));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, pieces, &destination]() {
      return send(pieces, destination);
    });
  } else {
    // If less than the whole message was sent, then it was truncated, and there's nothing we can
    // do about that now.
    return n;
  }
}